

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadTable
              (Scl_Tree_t *p,Vec_Str_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  void **ppvVar1;
  Vec_Flt_t *pVVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Scl_Item_t *pSVar10;
  long lVar11;
  int iVar12;
  Vec_Flt_t *pVVar13;
  Vec_Flt_t *pVVar14;
  Vec_Flt_t *local_58;
  Vec_Flt_t *local_50;
  Vec_Flt_t *local_40;
  
  uVar7 = pTiming->Child;
  iVar4 = p->nItems;
  if ((int)uVar7 < iVar4) {
    if ((int)uVar7 < 0) {
      return 0;
    }
    if (p->pItems == (Scl_Item_t *)0x0) {
      return 0;
    }
    pSVar10 = p->pItems + uVar7;
    pcVar6 = p->pContents;
    while( true ) {
      iVar3 = (pSVar10->Key).Beg;
      iVar12 = (pSVar10->Key).End - iVar3;
      iVar3 = strncmp(pcVar6 + iVar3,pName,(long)iVar12);
      if ((iVar3 == 0) && (sVar5 = strlen(pName), iVar12 == (int)sVar5)) break;
      uVar7 = pSVar10->Next;
      if (iVar4 <= (int)uVar7) goto LAB_003e9016;
      if ((int)uVar7 < 0) {
        return 0;
      }
      pSVar10 = p->pItems + uVar7;
      if (p->pItems == (Scl_Item_t *)0x0) {
        return 0;
      }
    }
    pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
    if (*pcVar6 == '\0') {
      uVar7 = pSVar10->Child;
      if (p->nItems <= (int)uVar7) goto LAB_003e9016;
      if ((-1 < (int)uVar7) && (p->pItems != (Scl_Item_t *)0x0)) {
        pSVar10 = p->pItems + uVar7;
        local_58 = (Vec_Flt_t *)0x0;
        local_40 = (Vec_Flt_t *)0x0;
        local_50 = (Vec_Flt_t *)0x0;
        do {
          iVar4 = (pSVar10->Key).Beg;
          pcVar6 = p->pContents + iVar4;
          iVar4 = (pSVar10->Key).End - iVar4;
          sVar5 = (size_t)iVar4;
          iVar3 = strncmp(pcVar6,"index_1",sVar5);
          if (iVar4 == 7 && iVar3 == 0) {
            if (local_50 != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex1 == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                            ,0x4b2,
                            "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
            local_50 = Scl_LibertyReadFloatVec(pcVar6);
          }
          else {
            iVar3 = strncmp(pcVar6,"index_2",sVar5);
            if ((iVar4 == 7) && (iVar3 == 0)) {
              if (local_40 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex2 == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                              ,0x4b4,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
              local_40 = Scl_LibertyReadFloatVec(pcVar6);
            }
            else {
              iVar3 = strncmp(pcVar6,"values",sVar5);
              if ((iVar4 == 6) && (iVar3 == 0)) {
                if (local_58 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vValues == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                                ,0x4b6,
                                "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
                local_58 = Scl_LibertyReadFloatVec(pcVar6);
              }
            }
          }
          uVar7 = pSVar10->Next;
          if (p->nItems <= (int)uVar7) goto LAB_003e9016;
        } while ((-1 < (int)uVar7) && (pSVar10 = p->pItems + uVar7, p->pItems != (Scl_Item_t *)0x0))
        ;
        if ((local_50 != (Vec_Flt_t *)0x0) &&
           ((local_40 != (Vec_Flt_t *)0x0 && (local_58 != (Vec_Flt_t *)0x0)))) {
          Vec_StrPutI_(vOut,local_50->nSize);
          if (0 < local_50->nSize) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,local_50->pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_50->nSize);
          }
          Vec_StrPutI_(vOut,local_40->nSize);
          iVar4 = local_40->nSize;
          if (0 < iVar4) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,local_40->pArray[lVar11]);
              lVar11 = lVar11 + 1;
              iVar4 = local_40->nSize;
            } while (lVar11 < iVar4);
          }
          iVar4 = iVar4 * local_50->nSize;
          if (iVar4 != local_58->nSize) {
            __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                          ,0x4c9,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          if (0 < iVar4) {
            lVar11 = 0;
            do {
              Vec_StrPutF_(vOut,local_58->pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_58->nSize);
          }
          goto LAB_003e8f7b;
        }
      }
      pcVar6 = "Incomplete table specification";
    }
    else {
      uVar7 = vTemples->nSize;
      if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          if (((uVar9 & 3) == 0) &&
             (iVar4 = strcmp(pcVar6,(char *)vTemples->pArray[uVar9]), iVar4 == 0)) {
            uVar8 = pSVar10->Child;
            if (p->nItems <= (int)uVar8) goto LAB_003e9016;
            if (((int)uVar8 < 0) || (p->pItems == (Scl_Item_t *)0x0)) {
              local_50 = (Vec_Flt_t *)0x0;
              local_40 = (Vec_Flt_t *)0x0;
              local_58 = (Vec_Flt_t *)0x0;
              goto LAB_003e8d63;
            }
            pSVar10 = p->pItems + uVar8;
            local_58 = (Vec_Flt_t *)0x0;
            local_40 = (Vec_Flt_t *)0x0;
            local_50 = (Vec_Flt_t *)0x0;
            goto LAB_003e8c2e;
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      pcVar6 = "Template cannot be found in the template library";
    }
    puts(pcVar6);
    return 0;
  }
LAB_003e9016:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  while ((-1 < (int)uVar7 && (pSVar10 = p->pItems + uVar7, p->pItems != (Scl_Item_t *)0x0))) {
LAB_003e8c2e:
    iVar4 = (pSVar10->Key).Beg;
    pcVar6 = p->pContents + iVar4;
    iVar4 = (pSVar10->Key).End - iVar4;
    sVar5 = (size_t)iVar4;
    iVar3 = strncmp(pcVar6,"index_1",sVar5);
    if (iVar4 == 7 && iVar3 == 0) {
      if (local_50 != (Vec_Flt_t *)0x0) {
        __assert_fail("vIndex1 == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                      ,0x4e1,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
      local_50 = Scl_LibertyReadFloatVec(pcVar6);
    }
    else {
      iVar3 = strncmp(pcVar6,"index_2",sVar5);
      if ((iVar4 == 7) && (iVar3 == 0)) {
        if (local_40 != (Vec_Flt_t *)0x0) {
          __assert_fail("vIndex2 == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                        ,0x4e3,
                        "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
        local_40 = Scl_LibertyReadFloatVec(pcVar6);
      }
      else {
        iVar3 = strncmp(pcVar6,"values",sVar5);
        if ((iVar4 == 6) && (iVar3 == 0)) {
          if (local_58 != (Vec_Flt_t *)0x0) {
            __assert_fail("vValues == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                          ,0x4e5,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar6 = Scl_LibertyReadString(p,pSVar10->Head);
          local_58 = Scl_LibertyReadFloatVec(pcVar6);
        }
      }
    }
    uVar7 = pSVar10->Next;
    if (p->nItems <= (int)uVar7) goto LAB_003e9016;
  }
  uVar7 = vTemples->nSize;
LAB_003e8d63:
  if (((int)uVar7 <= (int)uVar9 + 2) || (uVar7 <= (int)uVar9 + 3U)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar1 = vTemples->pArray;
  pVVar14 = (Vec_Flt_t *)ppvVar1[uVar9 + 2];
  pVVar2 = (Vec_Flt_t *)ppvVar1[uVar9 + 3];
  if (*(long *)((long)ppvVar1 + ((uVar9 & 0xffffffff) << 3 | 8)) == 0) {
    if ((local_50 != (Vec_Flt_t *)0x0) && (local_50->nSize != pVVar14->nSize)) {
      __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x4ec,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    pVVar13 = pVVar2;
    if ((local_40 != (Vec_Flt_t *)0x0) && (pVVar13 = local_40, local_40->nSize != pVVar2->nSize)) {
      __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x4ed,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    if (local_50 != (Vec_Flt_t *)0x0) {
      pVVar14 = local_50;
    }
    Vec_StrPutI_(vOut,pVVar14->nSize);
    if (0 < pVVar14->nSize) {
      lVar11 = 0;
      do {
        Vec_StrPutF_(vOut,pVVar14->pArray[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar14->nSize);
    }
    Vec_StrPutI_(vOut,pVVar13->nSize);
    iVar4 = pVVar13->nSize;
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        Vec_StrPutF_(vOut,pVVar13->pArray[lVar11]);
        lVar11 = lVar11 + 1;
        iVar4 = pVVar13->nSize;
      } while (lVar11 < iVar4);
    }
    iVar4 = iVar4 * pVVar14->nSize;
    if (iVar4 != local_58->nSize) {
      __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x4fc,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        Vec_StrPutF_(vOut,local_58->pArray[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_58->nSize);
    }
  }
  else {
    if ((local_40 != (Vec_Flt_t *)0x0) && (local_40->nSize != pVVar14->nSize)) {
      __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x506,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    pVVar13 = pVVar2;
    if ((local_50 != (Vec_Flt_t *)0x0) && (pVVar13 = local_50, local_50->nSize != pVVar2->nSize)) {
      __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x507,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    if (local_40 != (Vec_Flt_t *)0x0) {
      pVVar14 = local_40;
    }
    Vec_StrPutI_(vOut,pVVar14->nSize);
    if (0 < pVVar14->nSize) {
      lVar11 = 0;
      do {
        Vec_StrPutF_(vOut,pVVar14->pArray[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar14->nSize);
    }
    Vec_StrPutI_(vOut,pVVar13->nSize);
    iVar4 = pVVar13->nSize;
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        Vec_StrPutF_(vOut,pVVar13->pArray[lVar11]);
        lVar11 = lVar11 + 1;
        iVar4 = pVVar13->nSize;
      } while (lVar11 < iVar4);
    }
    uVar7 = iVar4 * pVVar14->nSize;
    if (uVar7 != local_58->nSize) {
      __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                    ,0x516,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    if (0 < (int)uVar7) {
      iVar4 = 0;
      do {
        uVar8 = (iVar4 % pVVar13->nSize) * pVVar14->nSize + iVar4 / pVVar13->nSize;
        if (((int)uVar8 < 0) || (uVar7 <= uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        Vec_StrPutF_(vOut,local_58->pArray[uVar8]);
        iVar4 = iVar4 + 1;
        uVar7 = local_58->nSize;
      } while (iVar4 < (int)uVar7);
    }
  }
LAB_003e8f7b:
  iVar4 = 3;
  do {
    Vec_StrPutF_(vOut,0.0);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = 4;
  do {
    Vec_StrPutF_(vOut,0.0);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = 6;
  do {
    Vec_StrPutF_(vOut,0.0);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_50 != (Vec_Flt_t *)0x0) {
    if (local_50->pArray != (float *)0x0) {
      free(local_50->pArray);
    }
    free(local_50);
  }
  if (local_40 != (Vec_Flt_t *)0x0) {
    if (local_40->pArray != (float *)0x0) {
      free(local_40->pArray);
    }
    free(local_40);
  }
  if (local_58 != (Vec_Flt_t *)0x0) {
    if (local_58->pArray != (float *)0x0) {
      free(local_58->pArray);
    }
    free(local_58);
    return 1;
  }
  return 1;
}

Assistant:

int Scl_LibertyReadTable( Scl_Tree_t * p, Vec_Str_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
        Vec_FltForEachEntry( vInd1, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
        Vec_FltForEachEntry( vInd2, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );
        // write entries
        assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
        Vec_FltForEachEntry( vValues, Entry, i )
        {
            Vec_StrPutF_( vOut, Entry );
            if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                Vec_StrPut_( vOut );
        }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
    }
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_FltFreeP( &vIndex1 );
    Vec_FltFreeP( &vIndex2 );
    Vec_FltFreeP( &vValues );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    return 1;
}